

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O2

void VSU_Write(void *info,UINT16 A,UINT8 V)

{
  byte *pbVar1;
  undefined4 uVar2;
  int i;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  vsu_state *chip;
  
  uVar5 = (uint)A;
  uVar10 = (uVar5 & 0x1ff) << 2;
  uVar9 = (ushort)uVar10;
  if (uVar9 < 0x280) {
    *(byte *)((long)info + (ulong)(uVar5 & 0x1f) + 0x39 + (ulong)(uVar5 & 0x1e0)) = V & 0x3f;
    return;
  }
  if (uVar9 < 0x400) {
    *(UINT8 *)((long)info + (ulong)(uVar5 & 0x1f) + 0xd9) = V;
    return;
  }
  if (0x5ff < uVar9) {
    return;
  }
  uVar10 = uVar10 >> 6 & 0xf;
  uVar3 = (ulong)uVar10;
  if (5 < uVar10) {
    if ((V & 1) == 0 || (uVar5 & 0x1ff) != 0x160) {
      return;
    }
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      pbVar1 = (byte *)((long)info + lVar4 + 8);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    return;
  }
  switch(uVar5 & 0xf) {
  case 0:
    *(byte *)((long)info + uVar3 + 8) = V & 0xbf;
    if ((char)V < '\0') {
      uVar5 = (uint)*(ushort *)((long)info + uVar3 * 2 + 0x1a);
      *(uint *)((long)info + uVar3 * 4 + 0xfc) = uVar5;
      iVar11 = 0x800 - uVar5;
      iVar6 = iVar11 * 10;
      if (uVar10 != 5) {
        iVar6 = iVar11;
      }
      *(int *)((long)info + uVar3 * 4 + 0x14c) = iVar6;
      *(uint *)((long)info + uVar3 * 4 + 0x164) = (uint)(byte)((V & 0x1f) + 1);
      *(uint *)((long)info + uVar3 * 4 + 0x17c) =
           (*(ushort *)((long)info + uVar3 * 2 + 0x26) & 7) + 1;
      if (uVar10 == 4) {
        *(uint *)((long)info + 0x194) = *(uint *)((long)info + 0x38) >> 4 & 7;
        uVar2 = 8;
        if (-1 < (char)*(uint *)((long)info + 0x38)) {
          uVar2 = 1;
        }
        *(undefined4 *)((long)info + 0x1e0) = uVar2;
        *(undefined1 *)((long)info + 0x132) = 0;
        *(undefined1 *)((long)info + uVar3 + 300) = 0;
      }
      else {
        *(undefined1 *)((long)info + uVar3 + 300) = 0;
        if (uVar10 == 5) {
          *(undefined4 *)((long)info + 0x1ec) = 1;
        }
      }
      *(undefined4 *)((long)info + uVar3 * 4 + 0x198) = 0x12c0;
      *(undefined4 *)((long)info + uVar3 * 4 + 0x1b0) = 4;
      *(undefined4 *)((long)info + uVar3 * 4 + 0x1c8) = 4;
      return;
    }
    break;
  case 1:
    *(UINT8 *)((long)info + uVar3 + 0xe) = V >> 4;
    *(byte *)((long)info + uVar3 + 0x14) = V & 0xf;
    return;
  case 2:
    uVar5 = (uint)V;
    *(UINT8 *)((long)info + (ulong)uVar10 * 2 + 0x1a) = V;
    uVar8 = (uint)*(byte *)((long)info + (ulong)uVar10 * 4 + 0xfd) << 8;
    goto LAB_0016112e;
  case 3:
    *(byte *)((long)info + (ulong)uVar10 * 2 + 0x1b) = V & 7;
    uVar5 = (uint)(V & 7) << 8;
    uVar8 = (uint)*(byte *)((long)info + (ulong)uVar10 * 4 + 0xfc);
LAB_0016112e:
    *(uint *)((long)info + (ulong)uVar10 * 4 + 0xfc) = uVar8 | uVar5;
    return;
  case 4:
    *(UINT8 *)((long)info + (ulong)uVar10 * 2 + 0x26) = V;
    *(uint *)((long)info + (ulong)uVar10 * 4 + 0x114) = (uint)(V >> 4);
    return;
  case 5:
    if ((uVar10 == 5) || (uVar10 == 4)) {
      bVar7 = V & 0x73;
    }
    else {
      bVar7 = V & 3;
    }
    *(ushort *)((long)info + (ulong)uVar10 * 2 + 0x26) =
         CONCAT11(bVar7,*(undefined1 *)((long)info + (ulong)uVar10 * 2 + 0x26));
    return;
  case 6:
    *(byte *)((long)info + uVar3 + 0x32) = V & 0xf;
    return;
  case 7:
    if (uVar10 == 4) {
      *(UINT8 *)((long)info + 0x38) = V;
      return;
    }
  }
  return;
}

Assistant:

static void VSU_Write(void* info, UINT16 A, UINT8 V)
{
	vsu_state* chip = (vsu_state*)info;
	
	A <<= 2;
	A &= 0x7FF;

	//printf("VSU Write: %d, %08x %02x\n", timestamp, A, V);

	if(A < 0x280)
		chip->WaveData[A >> 7][(A >> 2) & 0x1F] = V & 0x3F;
	else if(A < 0x400)
	{
		//if(A >= 0x300)
		// printf("Modulation mirror write? %08x %02x\n", A, V);
		chip->ModData[(A >> 2) & 0x1F] = V;
	}
	else if(A < 0x600)
	{
		int ch = (A >> 6) & 0xF;

		//if(ch < 6)
		//printf("Ch: %d, Reg: %d, Value: %02x\n", ch, (A >> 2) & 0xF, V);

		if(ch > 5)
		{
			if(A == 0x580 && (V & 1))
			{
				int i;
				//puts("STOP, HAMMER TIME");
				for(i = 0; i < 6; i++)
					chip->IntlControl[i] &= ~0x80;
			}
		}
		else
			switch((A >> 2) & 0xF)
			{
			case 0x0:
				chip->IntlControl[ch] = V & ~0x40;

				if(V & 0x80)
				{
					chip->EffFreq[ch] = chip->Frequency[ch];
					if(ch == 5)
						chip->FreqCounter[ch] = 10 * (2048 - chip->EffFreq[ch]);
					else
						chip->FreqCounter[ch] = 2048 - chip->EffFreq[ch];
					chip->IntervalCounter[ch] = (V & 0x1F) + 1;
					chip->EnvelopeCounter[ch] = (chip->EnvControl[ch] & 0x7) + 1;

					if(ch == 4)
					{
						chip->SweepModCounter = (chip->SweepControl >> 4) & 7;
						chip->SweepModClockDivider = (chip->SweepControl & 0x80) ? 8 : 1;
						chip->ModWavePos = 0;
					}

					chip->WavePos[ch] = 0;

					if(ch == 5)
						chip->lfsr = 1;

					//if(!(chip->IntlControl[ch] & 0x80))
					// chip->Envelope[ch] = (chip->EnvControl[ch] >> 4) & 0xF;

					chip->EffectsClockDivider[ch] = 4800;
					chip->IntervalClockDivider[ch] = 4;
					chip->EnvelopeClockDivider[ch] = 4;
				}
				break;

			case 0x1:
				chip->LeftLevel[ch] = (V >> 4) & 0xF;
				chip->RightLevel[ch] = (V >> 0) & 0xF;
				break;

			case 0x2:
				chip->Frequency[ch] &= 0xFF00;
				chip->Frequency[ch] |= V << 0;
				chip->EffFreq[ch] &= 0xFF00;
				chip->EffFreq[ch] |= V << 0;
				break;

			case 0x3:
				chip->Frequency[ch] &= 0x00FF;
				chip->Frequency[ch] |= (V & 0x7) << 8;
				chip->EffFreq[ch] &= 0x00FF;
				chip->EffFreq[ch] |= (V & 0x7) << 8;
				break;

			case 0x4:
				chip->EnvControl[ch] &= 0xFF00;
				chip->EnvControl[ch] |= V << 0;

				chip->Envelope[ch] = (V >> 4) & 0xF;
				break;

			case 0x5:
				chip->EnvControl[ch] &= 0x00FF;
				if(ch == 4)
					chip->EnvControl[ch] |= (V & 0x73) << 8;
				else if(ch == 5)
					chip->EnvControl[ch] |= (V & 0x73) << 8;
				else
					chip->EnvControl[ch] |= (V & 0x03) << 8;
				break;

			case 0x6:
				chip->RAMAddress[ch] = V & 0xF;
				break;

			case 0x7:
				if(ch == 4)
				{
					chip->SweepControl = V;
				}
				break;
			}
	}
}